

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  ImFont *this_00;
  ImFontConfig *pIVar1;
  ImFont **ppIVar2;
  void *__dest;
  ImFont *local_20;
  
  if (this->Locked == true) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                  ,0x640,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if ((font_cfg->FontData != (void *)0x0) && (0 < font_cfg->FontDataSize)) {
    if (font_cfg->SizePixels <= 0.0) {
      __assert_fail("font_cfg->SizePixels > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                    ,0x642,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
    }
    if (font_cfg->MergeMode == false) {
      this_00 = (ImFont *)ImGui::MemAlloc(0x70);
      ImFont::ImFont(this_00);
      local_20 = this_00;
      ImVector<ImFont_*>::push_back(&this->Fonts,&local_20);
    }
    else if ((this->Fonts).Size == 0) {
      __assert_fail("!Fonts.empty() && \"Cannot use MergeMode for the first font\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                    ,0x648,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
    }
    ImVector<ImFontConfig>::push_back(&this->ConfigData,font_cfg);
    pIVar1 = ImVector<ImFontConfig>::back(&this->ConfigData);
    if (pIVar1->DstFont == (ImFont *)0x0) {
      ppIVar2 = ImVector<ImFont_*>::back(&this->Fonts);
      pIVar1->DstFont = *ppIVar2;
    }
    if (pIVar1->FontDataOwnedByAtlas == false) {
      __dest = ImGui::MemAlloc((long)pIVar1->FontDataSize);
      pIVar1->FontData = __dest;
      pIVar1->FontDataOwnedByAtlas = true;
      memcpy(__dest,font_cfg->FontData,(long)pIVar1->FontDataSize);
    }
    ClearTexData(this);
    return pIVar1->DstFont;
  }
  __assert_fail("font_cfg->FontData != __null && font_cfg->FontDataSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                ,0x641,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
        Fonts.push_back(IM_NEW(ImFont));
    else
        IM_ASSERT(!Fonts.empty() && "Cannot use MergeMode for the first font"); // When using MergeMode make sure that a font has already been added before. You can use ImGui::GetIO().Fonts->AddFontDefault() to add the default imgui font.

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
    if (new_font_cfg.DstFont == NULL)
        new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = IM_ALLOC(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}